

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long lhs,
         SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long ret;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  unsigned_long local_28;
  longlong local_20;
  unsigned_long local_18;
  
  local_30.m_int = 0;
  local_28 = lhs;
  bVar1 = DivisionCornerCaseHelper<long_long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,&local_30);
  local_18 = local_30.m_int;
  if (!bVar1) {
    local_18 = 0;
    local_20 = rhs.m_int;
    DivisionHelper<unsigned_long,_long_long,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_28,&local_20,&local_18)
    ;
    if ((long)local_18 < 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  return (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_18;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}